

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O1

cmGlobalGenerator * __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalGhsMultiGenerator>::CreateGlobalGenerator
          (cmGlobalGeneratorSimpleFactory<cmGlobalGhsMultiGenerator> *this,string *name,cmake *cm)

{
  size_t __n;
  int iVar1;
  cmGlobalGhsMultiGenerator *this_00;
  bool bVar2;
  size_type __dnew;
  size_t *local_58;
  size_t local_50;
  size_t local_48 [2];
  size_t local_38;
  
  local_38 = 0x11;
  local_58 = local_48;
  local_58 = (size_t *)std::__cxx11::string::_M_create((ulong *)&local_58,(ulong)&local_38);
  local_48[0] = local_38;
  *local_58 = 0x6948206e65657247;
  local_58[1] = 0x544c554d20736c6c;
  *(char *)(local_58 + 2) = 'I';
  local_50 = local_38;
  *(char *)((long)local_58 + local_38) = '\0';
  __n = name->_M_string_length;
  bVar2 = true;
  if (__n == local_38) {
    if (__n == 0) {
      bVar2 = false;
    }
    else {
      iVar1 = bcmp((name->_M_dataplus)._M_p,local_58,__n);
      bVar2 = iVar1 != 0;
    }
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (bVar2) {
    this_00 = (cmGlobalGhsMultiGenerator *)0x0;
  }
  else {
    this_00 = (cmGlobalGhsMultiGenerator *)operator_new(0x640);
    cmGlobalGhsMultiGenerator::cmGlobalGhsMultiGenerator(this_00,cm);
  }
  return &this_00->super_cmGlobalGenerator;
}

Assistant:

cmGlobalGenerator* CreateGlobalGenerator(const std::string& name,
                                           cmake* cm) const override
  {
    if (name != T::GetActualName()) {
      return nullptr;
    }
    return new T(cm);
  }